

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RollbackTransaction(Parse *pParse)

{
  int iVar1;
  Vdbe *p;
  
  iVar1 = sqlite3AuthCheck(pParse,0x16,"ROLLBACK",(char *)0x0,(char *)0x0);
  if (iVar1 == 0) {
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      sqlite3VdbeAddOp3(p,3,1,1,0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackTransaction(Parse *pParse){
  Vdbe *v;

  assert( pParse!=0 );
  assert( pParse->db!=0 );
  if( sqlite3AuthCheck(pParse, SQLITE_TRANSACTION, "ROLLBACK", 0, 0) ){
    return;
  }
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3VdbeAddOp2(v, OP_AutoCommit, 1, 1);
  }
}